

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O0

StringSet * __thiscall
OSTEI_VRR_Algorithm_Base::GetVarReq_abi_cxx11_(OSTEI_VRR_Algorithm_Base *this,QAM *am)

{
  RRStepType RVar1;
  OSTEI_VRR_Algorithm_Base *in_RDX;
  StringSet *in_RDI;
  RRStepType rrstep;
  RRStepType in_stack_0000057c;
  QAM *in_stack_00000580;
  OSTEI_VRR_Algorithm_Base *in_stack_00000588;
  QAM *in_stack_ffffffffffffff38;
  QAM local_90 [2];
  RRStepType local_1c;
  
  QAM::QAM((QAM *)in_RDX,in_stack_ffffffffffffff38);
  RVar1 = GetRRStep(in_RDX,in_stack_ffffffffffffff38);
  QAM::~QAM((QAM *)0x1205c4);
  local_1c = RVar1;
  QAM::QAM((QAM *)in_RDX,local_90);
  GenerateVarReq_abi_cxx11_(in_stack_00000588,in_stack_00000580,in_stack_0000057c);
  QAM::~QAM((QAM *)0x120608);
  return in_RDI;
}

Assistant:

StringSet OSTEI_VRR_Algorithm_Base::GetVarReq(QAM am) const
{
    RRStepType rrstep = GetRRStep(am);
    return GenerateVarReq(am, rrstep);
}